

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddInternal<google::protobuf::internal::RepeatedPtrFieldBase::AddString()::__0>
          (RepeatedPtrFieldBase *this)

{
  bool bVar1;
  int iVar2;
  Arena *arena_00;
  void *pvVar3;
  void **ppvVar4;
  Rep *pRVar5;
  void **result;
  Rep *r;
  Rep *r_1;
  void **result_1;
  Arena *arena;
  RepeatedPtrFieldBase *this_local;
  void *local_18;
  void *local_10;
  
  arena_00 = GetArena(this);
  if (this->tagged_rep_or_elem_ == (void *)0x0) {
    ExchangeCurrentSize(this,1);
    pvVar3 = AddString::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)((long)&this_local + 7),arena_00);
    this->tagged_rep_or_elem_ = pvVar3;
    local_18 = this->tagged_rep_or_elem_;
  }
  else {
    local_10 = this->tagged_rep_or_elem_;
    bVar1 = using_sso(this);
    if (bVar1) {
      if (this->current_size_ == 0) {
        ExchangeCurrentSize(this,1);
        local_18 = this->tagged_rep_or_elem_;
      }
      else {
        ppvVar4 = InternalExtend(this,1);
        pvVar3 = AddString::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)((long)&this_local + 7),arena_00);
        *ppvVar4 = pvVar3;
        pRVar5 = rep(this);
        pRVar5->allocated_size = 2;
        ExchangeCurrentSize(this,2);
        local_18 = *ppvVar4;
      }
    }
    else {
      result = (void **)rep(this);
      bVar1 = SizeAtCapacity(this);
      if (bVar1) {
        InternalExtend(this,1);
        result = (void **)rep(this);
      }
      else if (this->current_size_ != ((Rep *)result)->allocated_size) {
        iVar2 = ExchangeCurrentSize(this,this->current_size_ + 1);
        return ((Rep *)result)->elements[iVar2];
      }
      *(int *)result = *(int *)result + 1;
      iVar2 = ExchangeCurrentSize(this,this->current_size_ + 1);
      pvVar3 = AddString::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)((long)&this_local + 7),arena_00);
      result[(long)iVar2 + 1] = pvVar3;
      local_18 = result[(long)iVar2 + 1];
    }
  }
  return local_18;
}

Assistant:

void* RepeatedPtrFieldBase::AddInternal(Factory factory) {
  Arena* const arena = GetArena();
  if (tagged_rep_or_elem_ == nullptr) {
    ExchangeCurrentSize(1);
    tagged_rep_or_elem_ = factory(arena);
    return tagged_rep_or_elem_;
  }
  absl::PrefetchToLocalCache(tagged_rep_or_elem_);
  if (using_sso()) {
    if (current_size_ == 0) {
      ExchangeCurrentSize(1);
      return tagged_rep_or_elem_;
    }
    void*& result = *InternalExtend(1);
    result = factory(arena);
    Rep* r = rep();
    r->allocated_size = 2;
    ExchangeCurrentSize(2);
    return result;
  }
  Rep* r = rep();
  if (ABSL_PREDICT_FALSE(SizeAtCapacity())) {
    InternalExtend(1);
    r = rep();
  } else {
    if (current_size_ != r->allocated_size) {
      return r->elements[ExchangeCurrentSize(current_size_ + 1)];
    }
  }
  ++r->allocated_size;
  void*& result = r->elements[ExchangeCurrentSize(current_size_ + 1)];
  result = factory(arena);
  return result;
}